

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O1

bool QtPrivate::QEqualityOperatorForType<QVector3D,_true>::equals
               (QMetaTypeInterface *param_1,void *a,void *b)

{
  return (bool)(-((float)((ulong)*a >> 0x20) == (float)((ulong)*b >> 0x20)) &
               (*(float *)((long)a + 8) == *(float *)((long)b + 8) && (float)*a == (float)*b));
}

Assistant:

static bool equals(const QMetaTypeInterface *, const void *a, const void *b)
    { return *reinterpret_cast<const T *>(a) == *reinterpret_cast<const T *>(b); }